

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneobject.cpp
# Opt level: O0

void __thiscall SceneObject::SceneObject(SceneObject *this,mat4 *ltw,ColorRGB c)

{
  mat4 *m;
  int local_b4 [4];
  tvec4<float> local_a4;
  tvec4<float> local_94;
  tvec3<float> local_84;
  tmat4x4<float> local_78;
  mat4 *local_38;
  mat4 *ltw_local;
  SceneObject *this_local;
  float local_1c;
  undefined8 local_14;
  ColorRGB c_local;
  
  local_1c = c.b;
  register0x00001200 = c._0_8_;
  this->_vptr_SceneObject = (_func_int **)&PTR__SceneObject_00119d58;
  local_38 = ltw;
  ltw_local = (mat4 *)this;
  local_14 = register0x00001200;
  c_local.r = local_1c;
  ColorRGB::ColorRGB(&this->color);
  glm::detail::tvec3<float>::tvec3(&this->position);
  glm::detail::tmat4x4<float>::tmat4x4(&this->localToWorld);
  glm::detail::tmat4x4<float>::tmat4x4(&this->worldToLocal);
  glm::detail::tmat4x4<float>::operator=(&this->localToWorld,local_38);
  glm::inverse<float>(&local_78,local_38);
  glm::detail::tmat4x4<float>::operator=(&this->worldToLocal,&local_78);
  m = local_38;
  (this->color).r = (float)(undefined4)local_14;
  (this->color).g = (float)local_14._4_4_;
  (this->color).b = c_local.r;
  local_b4[3] = 0;
  local_b4[2] = 0;
  local_b4[1] = 0;
  local_b4[0] = 1;
  glm::detail::tvec4<float>::tvec4<int,int,int,int>
            (&local_a4,local_b4 + 3,local_b4 + 2,local_b4 + 1,local_b4);
  glm::detail::operator*((detail *)&local_94,m,&local_a4);
  glm::detail::tvec3<float>::tvec3<float>(&local_84,&local_94);
  glm::detail::tvec3<float>::operator=(&this->position,&local_84);
  return;
}

Assistant:

SceneObject::SceneObject(const glm::mat4 &ltw, ColorRGB c) {
    localToWorld = ltw;
    worldToLocal = glm::inverse(ltw);
    color = c;
    
    position = glm::vec3(ltw * glm::vec4(0, 0, 0, 1)); //poor mans swizzling
}